

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O0

fiobj_object_vtable_s * fiobj_type_vtable(FIOBJ o)

{
  fiobj_type_enum fVar1;
  FIOBJ o_local;
  
  fVar1 = fiobj_type(o);
  switch(fVar1) {
  case FIOBJ_T_NUMBER:
    o_local = (FIOBJ)&FIOBJECT_VTABLE_NUMBER;
    break;
  default:
    o_local = 0;
    break;
  case FIOBJ_T_NULL:
  case FIOBJ_T_TRUE:
  case FIOBJ_T_FALSE:
  case FIOBJ_T_UNKNOWN:
    o_local = 0;
    break;
  case FIOBJ_T_FLOAT:
    o_local = (FIOBJ)&FIOBJECT_VTABLE_FLOAT;
    break;
  case FIOBJ_T_STRING:
    o_local = (FIOBJ)&FIOBJECT_VTABLE_STRING;
    break;
  case FIOBJ_T_ARRAY:
    o_local = (FIOBJ)&FIOBJECT_VTABLE_ARRAY;
    break;
  case FIOBJ_T_HASH:
    o_local = (FIOBJ)&FIOBJECT_VTABLE_HASH;
    break;
  case FIOBJ_T_DATA:
    o_local = (FIOBJ)&FIOBJECT_VTABLE_DATA;
  }
  return (fiobj_object_vtable_s *)o_local;
}

Assistant:

FIO_INLINE const fiobj_object_vtable_s *fiobj_type_vtable(FIOBJ o) {
  switch (FIOBJ_TYPE(o)) {
  case FIOBJ_T_NUMBER:
    return &FIOBJECT_VTABLE_NUMBER;
  case FIOBJ_T_FLOAT:
    return &FIOBJECT_VTABLE_FLOAT;
  case FIOBJ_T_STRING:
    return &FIOBJECT_VTABLE_STRING;
  case FIOBJ_T_ARRAY:
    return &FIOBJECT_VTABLE_ARRAY;
  case FIOBJ_T_HASH:
    return &FIOBJECT_VTABLE_HASH;
  case FIOBJ_T_DATA:
    return &FIOBJECT_VTABLE_DATA;
  case FIOBJ_T_NULL:
  case FIOBJ_T_TRUE:
  case FIOBJ_T_FALSE:
  case FIOBJ_T_UNKNOWN:
    return NULL;
  }
  return NULL;
}